

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,operation_t op,string *msg,
          seconds32 retry_interval)

{
  int *piVar1;
  undefined1 *puVar2;
  error_code *peVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pcVar8;
  pointer paVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined3 uVar13;
  bool bVar14;
  bool bVar15;
  char cVar16;
  event_t e;
  int iVar17;
  time_point32 now;
  char *pcVar18;
  announce_entry *ae;
  announce_endpoint *paVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar20;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer paVar21;
  pointer paVar22;
  endpoint *ep;
  endpoint *extraout_RDX;
  endpoint *ep_00;
  endpoint *extraout_RDX_00;
  endpoint *ep_01;
  long lVar23;
  long *plVar24;
  long lVar25;
  announce_infohash *this_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  protocol_version hash_version;
  operation_t op_local;
  endpoint local_endpoint_1;
  int fails;
  tracker_list *local_98;
  string *local_90;
  seconds32 local_84;
  announce_entry *local_80;
  endpoint local_endpoint;
  protocol_version hash_version_1;
  
  op_local = op;
  local_90 = msg;
  local_84.__r = retry_interval.__r;
  bVar14 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
  bVar15 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = !bVar15;
  supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = !bVar14;
  iVar17 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar17 != '\0') {
    uVar5 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(&local_endpoint_1,ec->cat_,(ulong)uVar5);
    uVar11 = local_endpoint_1.impl_.data_._0_8_;
    pcVar18 = operation_name(op);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s [%s] %s",(ulong)uVar5,uVar11,pcVar18,
               (local_90->_M_dataplus)._M_p);
    if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
        (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
      operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                      CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                               local_endpoint_1.impl_.data_._16_4_) + 1);
    }
  }
  local_98 = &this->m_trackers;
  bVar4 = (r->kind).m_val;
  ae = tracker_list::find_tracker(local_98,&r->url);
  if ((bVar4 & 1) == 0) {
    fails = 0;
    local_endpoint.impl_.data_.v6.sin6_scope_id = 0;
    local_endpoint.impl_.data_._8_4_ = 0;
    local_endpoint.impl_.data_._12_4_ = 0;
    local_endpoint.impl_.data_._16_4_ = 0;
    local_endpoint.impl_.data_._20_4_ = 0;
    local_endpoint.impl_.data_._0_8_ = 2;
    hash_version = V1;
    if (ae != (announce_entry *)0x0) {
      paVar19 = announce_entry::find_endpoint(ae,&r->outgoing_socket);
      if (paVar19 == (announce_endpoint *)0x0) {
        p_Var7 = (r->outgoing_socket).m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var7->_M_use_count != 0)) {
          pcVar8 = (r->url)._M_dataplus._M_p;
          listen_socket_handle::get_local_endpoint((endpoint *)&hash_version_1,&r->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)&hash_version_1,ep_00);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",pcVar8,
                     local_endpoint_1.impl_.data_._0_8_);
          if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ !=
              (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10)) {
            operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                            CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                     local_endpoint_1.impl_.data_._16_4_) + 1);
          }
        }
      }
      else {
        auVar26[0] = -((char)(r->info_hash).m_number._M_elems[0] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[0]);
        auVar26[1] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 1) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
        auVar26[2] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 2) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
        auVar26[3] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 3) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
        auVar26[4] = -((char)(r->info_hash).m_number._M_elems[1] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[1]);
        auVar26[5] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 5) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
        auVar26[6] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 6) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
        auVar26[7] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 7) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
        auVar26[8] = -((char)(r->info_hash).m_number._M_elems[2] ==
                      (char)(this->m_info_hash).v1.m_number._M_elems[2]);
        auVar26[9] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 9) ==
                      *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
        auVar26[10] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 10) ==
                       *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
        auVar26[0xb] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xb) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
        auVar26[0xc] = -((char)(r->info_hash).m_number._M_elems[3] ==
                        (char)(this->m_info_hash).v1.m_number._M_elems[3]);
        auVar26[0xd] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xd) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
        auVar26[0xe] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xe) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
        auVar26[0xf] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xf) ==
                        *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
        uVar5 = (this->m_info_hash).v1.m_number._M_elems[4];
        uVar6 = (r->info_hash).m_number._M_elems[4];
        auVar28[0] = -((char)uVar6 == (char)uVar5);
        auVar28[1] = -((char)(uVar6 >> 8) == (char)(uVar5 >> 8));
        auVar28[2] = -((char)(uVar6 >> 0x10) == (char)(uVar5 >> 0x10));
        auVar28[3] = -((char)(uVar6 >> 0x18) == (char)(uVar5 >> 0x18));
        auVar28[4] = 0xff;
        auVar28[5] = 0xff;
        auVar28[6] = 0xff;
        auVar28[7] = 0xff;
        auVar28[8] = 0xff;
        auVar28[9] = 0xff;
        auVar28[10] = 0xff;
        auVar28[0xb] = 0xff;
        auVar28[0xc] = 0xff;
        auVar28[0xd] = 0xff;
        auVar28[0xe] = 0xff;
        auVar28[0xf] = 0xff;
        auVar28 = auVar28 & auVar26;
        bVar15 = (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) != 0xffff;
        this_00 = (paVar19->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems + bVar15;
        local_endpoint.impl_.data_._0_8_ = *(undefined8 *)&(paVar19->local_endpoint).impl_.data_;
        uVar11 = *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0xc);
        uVar12 = *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0x14);
        local_endpoint.impl_.data_._8_4_ =
             (undefined4)*(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 8);
        local_endpoint.impl_.data_._12_4_ = (undefined4)uVar11;
        local_endpoint.impl_.data_._16_4_ = (undefined4)((ulong)uVar11 >> 0x20);
        local_endpoint.impl_.data_._20_4_ = (undefined4)uVar12;
        local_endpoint.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar12 >> 0x20);
        hash_version = bVar15;
        local_80 = ae;
        iVar17 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        local_endpoint_1.impl_.data_._0_8_ = CONCAT44(extraout_var,iVar17) + 0x438;
        local_endpoint_1.impl_.data_._8_4_ = local_endpoint_1.impl_.data_._8_4_ & 0xffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_endpoint_1);
        local_endpoint_1.impl_.data_.base.sa_data[6] = 1;
        iVar17 = *(int *)(CONCAT44(extraout_var,iVar17) + 0x358);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_endpoint_1);
        announce_infohash::failed(this_00,iVar17,local_84);
        bVar14 = ec->failed_;
        uVar13 = *(undefined3 *)&ec->field_0x5;
        peVar20 = ec->cat_;
        peVar3 = &(paVar19->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar15].last_error;
        peVar3->val_ = ec->val_;
        peVar3->failed_ = bVar14;
        *(undefined3 *)&peVar3->field_0x5 = uVar13;
        peVar3->cat_ = peVar20;
        ::std::__cxx11::string::_M_assign((string *)this_00);
        fails = *(ushort *)
                 &(paVar19->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar15].field_0x44 & 0x7f;
        print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar19,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",
                   local_endpoint_1.impl_.data_._0_8_,(r->url)._M_dataplus._M_p,
                   (ulong)(*(ushort *)
                            &(paVar19->info_hashes).
                             super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[bVar15].
                             field_0x44 & 0x7f));
        puVar2 = (undefined1 *)((long)&local_endpoint_1.impl_.data_ + 0x10);
        if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ != puVar2) {
          operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                          CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                   local_endpoint_1.impl_.data_._16_4_) + 1);
        }
        local_endpoint_1.impl_.data_._0_8_ = 0x100000061;
        local_endpoint_1.impl_.data_._8_4_ = 0x4decd0;
        local_endpoint_1.impl_.data_._12_4_ = 0;
        iVar17 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
        ep_01 = extraout_RDX;
        if (((char)iVar17 != '\0') ||
           (cVar16 = (**(code **)(*(long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                                                    local_endpoint_1.impl_.data_._8_4_) + 0x18))
                               ((long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                                                 local_endpoint_1.impl_.data_._8_4_),ec,
                                local_endpoint_1.impl_.data_._0_8_ & 0xffffffff),
           ep_01 = extraout_RDX_00, ae = local_80, cVar16 != '\0')) {
          paVar19->field_0xb0 = paVar19->field_0xb0 & 0xfe;
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar19,ep_01);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** disabling endpoint [ep: %s url: %s ]",
                     local_endpoint_1.impl_.data_._0_8_,(r->url)._M_dataplus._M_p);
          ae = local_80;
          if ((undefined1 *)local_endpoint_1.impl_.data_._0_8_ != puVar2) {
            operator_delete((void *)local_endpoint_1.impl_.data_._0_8_,
                            CONCAT44(local_endpoint_1.impl_.data_._20_4_,
                                     local_endpoint_1.impl_.data_._16_4_) + 1);
            ae = local_80;
          }
        }
      }
      peVar20 = http_category();
      if ((peVar20->id_ != 0x8fafd21e25c5e09b) && (peVar20->id_ != 0xb2ab117a257edf0d)) {
        (*peVar20->_vptr_error_category[6])(peVar20,0x19a);
      }
      if (ec->val_ == 0x19a) {
        bVar14 = ec->cat_->id_ == peVar20->id_;
        if (peVar20->id_ == 0) {
          bVar14 = ec->cat_ == peVar20;
        }
        if (bVar14) {
          tracker_list::dont_try_again(local_98,ae);
        }
      }
      paVar22 = (ae->endpoints).
                super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar9 = (ae->endpoints).
               super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar25 = (long)paVar9 - (long)paVar22;
      lVar23 = (lVar25 >> 3) * -0x70a3d70a3d70a3d7 >> 2;
      if (0 < lVar23) {
        paVar21 = paVar22 + lVar23 * 4;
        do {
          lVar25 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]] == true) &&
               (((paVar22->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]].
                 field_0x44 & 0x7f) == 0)) goto LAB_0032b7b1;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 2);
          lVar25 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]] == true) &&
               ((paVar22[1].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]].
                 field_0x44 & 0x7f) == 0)) {
              paVar22 = paVar22 + 1;
              goto LAB_0032b7b1;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 2);
          lVar25 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]] == true) &&
               ((paVar22[2].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]].
                 field_0x44 & 0x7f) == 0)) {
              paVar22 = paVar22 + 2;
              goto LAB_0032b7b1;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 2);
          lVar25 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]] == true) &&
               ((paVar22[3].info_hashes.super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25]].
                 field_0x44 & 0x7f) == 0)) {
              paVar22 = paVar22 + 3;
              goto LAB_0032b7b1;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 2);
          paVar22 = paVar22 + 4;
          bVar14 = 1 < lVar23;
          lVar23 = lVar23 + -1;
        } while (bVar14);
        lVar25 = (long)paVar9 - (long)paVar21;
        paVar22 = paVar21;
      }
      lVar23 = (lVar25 >> 3) * -0x70a3d70a3d70a3d7;
      if (lVar23 != 1) {
        if (lVar23 != 2) {
          if (lVar23 != 3) goto LAB_0032b7b6;
          lVar23 = 0;
          do {
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
                 [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == true) &&
               (((paVar22->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].
                 field_0x44 & 0x7f) == 0)) goto LAB_0032b7b1;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 2);
          paVar22 = paVar22 + 1;
        }
        lVar23 = 0;
        do {
          if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == true) &&
             (((paVar22->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
               [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].field_0x44 & 0x7f)
              == 0)) goto LAB_0032b7b1;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        paVar22 = paVar22 + 1;
      }
      lVar23 = 0;
      do {
        if ((supports_protocol.super_array<const_bool,_2UL>._M_elems
             [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == true) &&
           (((paVar22->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
             [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].field_0x44 & 0x7f)
            == 0)) goto LAB_0032b7b1;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 2);
      goto LAB_0032b7b6;
    }
    goto LAB_0032b7c3;
  }
  peVar20 = http_category();
  if ((peVar20->id_ != 0x8fafd21e25c5e09b) && (peVar20->id_ != 0xb2ab117a257edf0d)) {
    (*peVar20->_vptr_error_category[6])(peVar20,0x19a);
  }
  if (ec->val_ == 0x19a) {
    bVar15 = ec->cat_->id_ == peVar20->id_;
    if (peVar20->id_ == 0) {
      bVar15 = ec->cat_ == peVar20;
    }
    bVar14 = ae != (announce_entry *)0x0;
    if ((bVar14) && (bVar15)) {
      tracker_list::dont_try_again(local_98,ae);
      bVar14 = true;
    }
  }
  else {
    bVar14 = ae != (announce_entry *)0x0;
  }
  iVar17 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5])();
  if (((*(uint *)(CONCAT44(extraout_var_00,iVar17) + 0x68) & 0x11) != 0) ||
     (r->triggered_manually == true)) {
    local_endpoint_1.impl_.data_._8_4_ = 0;
    local_endpoint_1.impl_.data_._12_4_ = 0;
    local_endpoint_1.impl_.data_._16_4_ = 0;
    local_endpoint_1.impl_.data_._20_4_ = 0;
    local_endpoint_1.impl_.data_.v6.sin6_scope_id = 0;
    local_endpoint_1.impl_.data_._0_8_ = 2;
    if ((bVar14) &&
       (paVar19 = announce_entry::find_endpoint(ae,&r->outgoing_socket),
       paVar19 != (announce_endpoint *)0x0)) {
      local_endpoint_1.impl_.data_._0_8_ = *(undefined8 *)&(paVar19->local_endpoint).impl_.data_;
      uVar11 = *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 8);
      uVar12 = *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0x14);
      local_endpoint_1.impl_.data_._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_endpoint_1.impl_.data_._20_4_ = (undefined4)uVar12;
      local_endpoint_1.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar12 >> 0x20);
      local_endpoint_1.impl_.data_._8_4_ = (undefined4)uVar11;
      local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
    }
    auVar27[0] = -((char)(r->info_hash).m_number._M_elems[0] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[0]);
    auVar27[1] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 1) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
    auVar27[2] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 2) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
    auVar27[3] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 3) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
    auVar27[4] = -((char)(r->info_hash).m_number._M_elems[1] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[1]);
    auVar27[5] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 5) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
    auVar27[6] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 6) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
    auVar27[7] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 7) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
    auVar27[8] = -((char)(r->info_hash).m_number._M_elems[2] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[2]);
    auVar27[9] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 9) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
    auVar27[10] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 10) ==
                   *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
    auVar27[0xb] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xb) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
    auVar27[0xc] = -((char)(r->info_hash).m_number._M_elems[3] ==
                    (char)(this->m_info_hash).v1.m_number._M_elems[3]);
    auVar27[0xd] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xd) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
    auVar27[0xe] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xe) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
    auVar27[0xf] = -(*(char *)((long)(r->info_hash).m_number._M_elems + 0xf) ==
                    *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
    uVar5 = (this->m_info_hash).v1.m_number._M_elems[4];
    uVar6 = (r->info_hash).m_number._M_elems[4];
    auVar29[0] = -((char)uVar6 == (char)uVar5);
    auVar29[1] = -((char)(uVar6 >> 8) == (char)(uVar5 >> 8));
    auVar29[2] = -((char)(uVar6 >> 0x10) == (char)(uVar5 >> 0x10));
    auVar29[3] = -((char)(uVar6 >> 0x18) == (char)(uVar5 >> 0x18));
    auVar29[4] = 0xff;
    auVar29[5] = 0xff;
    auVar29[6] = 0xff;
    auVar29[7] = 0xff;
    auVar29[8] = 0xff;
    auVar29[9] = 0xff;
    auVar29[10] = 0xff;
    auVar29[0xb] = 0xff;
    auVar29[0xc] = 0xff;
    auVar29[0xd] = 0xff;
    auVar29[0xe] = 0xff;
    auVar29[0xf] = 0xff;
    auVar29 = auVar29 & auVar27;
    hash_version_1 =
         (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff;
    iVar17 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&local_endpoint);
    alert_manager::
    emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version&,std::__cxx11::string_const&,boost::system::error_code_const&>
              ((alert_manager *)CONCAT44(extraout_var_01,iVar17),(torrent_handle *)&local_endpoint,
               &local_endpoint_1,&hash_version_1,&r->url,ec);
    plVar24 = (long *)CONCAT44(local_endpoint.impl_.data_._12_4_,local_endpoint.impl_.data_._8_4_);
    goto LAB_0032b835;
  }
LAB_0032b866:
  uVar10 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar10 & 0x1c000000) == 0) {
    e = r->event;
    if (e != stopped && (uVar10 & 0xe00000000000000) == 0x200000000000000) goto LAB_0032b885;
  }
  else {
    e = stopped;
    if (r->event != stopped) goto LAB_0032b885;
  }
  announce_with_tracker(this,e);
LAB_0032b885:
  now = time_now32();
  update_tracker_timer(this,now);
  return;
LAB_0032b7b1:
  if (paVar22 == paVar9) {
LAB_0032b7b6:
    tracker_list::deprioritize_tracker(local_98,ae);
  }
LAB_0032b7c3:
  iVar17 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5])();
  if (((*(uint *)(CONCAT44(extraout_var_02,iVar17) + 0x68) & 0x11) != 0) ||
     (r->triggered_manually == true)) {
    iVar17 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&local_endpoint_1);
    alert_manager::
    emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,libtorrent::protocol_version&,std::__cxx11::string_const&,libtorrent::operation_t_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar17),(torrent_handle *)&local_endpoint_1
               ,&local_endpoint,&fails,&hash_version,&r->url,&op_local,ec,local_90);
    plVar24 = (long *)CONCAT44(local_endpoint_1.impl_.data_._12_4_,
                               local_endpoint_1.impl_.data_._8_4_);
LAB_0032b835:
    if (plVar24 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar24 + 0xc);
        iVar17 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar17 = *(int *)((long)plVar24 + 0xc);
        *(int *)((long)plVar24 + 0xc) = iVar17 + -1;
      }
      if (iVar17 == 1) {
        (**(code **)(*plVar24 + 0x18))();
      }
    }
  }
  goto LAB_0032b866;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, operation_t const op, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s [%s] %s", ec.value()
				, ec.message().c_str(), operation_name(op), msg.c_str());
		}
#endif
		if (!(r.kind & tracker_request::scrape_request))
		{
			// announce request
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			protocol_version hash_version = protocol_version::V1;
			if (ae)
			{
				auto* aep = ae->find_endpoint(r.outgoing_socket);
				if (aep)
				{
					hash_version = r.info_hash == m_info_hash.v1
						? protocol_version::V1 : protocol_version::V2;
					auto& a = aep->info_hashes[hash_version];
					local_endpoint = aep->local_endpoint;
					a.failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					a.last_error = ec;
					a.message = msg;
					fails = a.fails;

#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), a.fails);
#endif
					if (ec == boost::system::errc::address_family_not_supported)
					{
						// don't try to announce from this endpoint again
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) m_trackers.dont_try_again(ae);

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [&](aux::announce_endpoint const& ep)
					{
						for (protocol_version const ih : all_versions)
							if (supports_protocol[ih] && ep.info_hashes[ih].is_working())
								return false;
						return true;
					}))
				{
					m_trackers.deprioritize_tracker(ae);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, hash_version, r.url, op, ec, msg);
			}
		}
		else
		{
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()) && ae)
				m_trackers.dont_try_again(ae);

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae)
				{
					auto const* aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				protocol_version hash_version = r.info_hash == m_info_hash.v1
					? protocol_version::V1 : protocol_version::V2;

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle()
					, local_endpoint, hash_version, r.url, ec);
			}
		}
		// announce to the next working tracker
		// We may have changed state into checking by now, in which case we
		// shouldn't keep trying to announce
		if ((!m_abort && !is_paused() && state() != torrent_status::checking_files)
			|| r.event == event_t::stopped)
		{
			announce_with_tracker(r.event);
		}
		update_tracker_timer(aux::time_now32());
	}